

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall
tinygltf::OrthographicCamera::operator==(OrthographicCamera *this,OrthographicCamera *other)

{
  bool bVar1;
  
  bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t);
  if ((((bVar1) && (bVar1 = Equals(&this->extras,&other->extras), bVar1)) &&
      (ABS(other->xmag - this->xmag) < 1e-12)) &&
     ((ABS(other->ymag - this->ymag) < 1e-12 && (ABS(other->zfar - this->zfar) < 1e-12)))) {
    return ABS(other->znear - this->znear) < 1e-12;
  }
  return false;
}

Assistant:

bool OrthographicCamera::operator==(const OrthographicCamera &other) const {
  return this->extensions == other.extensions && this->extras == other.extras &&
         TINYGLTF_DOUBLE_EQUAL(this->xmag, other.xmag) &&
         TINYGLTF_DOUBLE_EQUAL(this->ymag, other.ymag) &&
         TINYGLTF_DOUBLE_EQUAL(this->zfar, other.zfar) &&
         TINYGLTF_DOUBLE_EQUAL(this->znear, other.znear);
}